

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

int str_lower(lua_State *L)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  size_t l;
  luaL_Buffer b;
  ulong local_2048;
  luaL_Buffer local_2040;
  
  pcVar3 = luaL_checklstring(L,1,&local_2048);
  luaL_buffinit(L,&local_2040);
  if (local_2048 != 0) {
    uVar4 = 0;
    do {
      if (&stack0xffffffffffffffd8 <= local_2040.p) {
        luaL_prepbuffer(&local_2040);
      }
      pcVar1 = local_2040.p;
      iVar2 = tolower((uint)(byte)pcVar3[uVar4]);
      local_2040.p = pcVar1 + 1;
      *pcVar1 = (char)iVar2;
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_2048);
  }
  luaL_pushresult(&local_2040);
  return 1;
}

Assistant:

static int str_lower (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  luaL_buffinit(L, &b);
  for (i=0; i<l; i++)
    luaL_addchar(&b, tolower(uchar(s[i])));
  luaL_pushresult(&b);
  return 1;
}